

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::TableScanDeserialize(Deserializer *deserializer,TableFunction *function)

{
  ClientContext *context;
  DuckTableEntry *args;
  pointer pTVar1;
  SerializationException *this;
  allocator local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> catalog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Deserializer::ReadProperty<std::__cxx11::string>(&catalog,(Deserializer *)function,100,"catalog");
  Deserializer::ReadProperty<std::__cxx11::string>(&schema,(Deserializer *)function,0x65,"schema");
  Deserializer::ReadProperty<std::__cxx11::string>(&table,(Deserializer *)function,0x66,"table");
  context = SerializationData::Get<duckdb::ClientContext&>
                      ((SerializationData *)
                       &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.
                        super_Function.name._M_string_length);
  args = (DuckTableEntry *)
         Catalog::GetEntry<duckdb::TableCatalogEntry>
                   (context,&catalog,&schema,&table,(QueryErrorContext)0xffffffffffffffff);
  if ((args->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
      type == TABLE_ENTRY) {
    make_uniq<duckdb::TableScanBindData,duckdb::DuckTableEntry&>((duckdb *)&local_d8,args);
    pTVar1 = unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
             ::operator->((unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
                           *)&local_d8);
    Deserializer::ReadProperty<bool>
              ((Deserializer *)function,0x67,"is_index_scan",&pTVar1->is_index_scan);
    pTVar1 = unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
             ::operator->((unique_ptr<duckdb::TableScanBindData,_std::default_delete<duckdb::TableScanBindData>,_true>
                           *)&local_d8);
    Deserializer::ReadProperty<bool>
              ((Deserializer *)function,0x68,"is_create_index",&pTVar1->is_create_index);
    Deserializer::ReadDeletedProperty<duckdb::vector<long,false>>
              ((Deserializer *)function,0x69,"result_ids");
    deserializer->_vptr_Deserializer = (_func_int **)local_d8._M_dataplus._M_p;
    ::std::__cxx11::string::~string((string *)&table);
    ::std::__cxx11::string::~string((string *)&schema);
    ::std::__cxx11::string::~string((string *)&catalog);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           deserializer;
  }
  this = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_d8,"Cant find table for %s.%s",&local_d9);
  ::std::__cxx11::string::string((string *)&local_38,(string *)&schema);
  ::std::__cxx11::string::string((string *)&local_58,(string *)&table);
  SerializationException::SerializationException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_d8,&local_38,&local_58);
  __cxa_throw(this,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> TableScanDeserialize(Deserializer &deserializer, TableFunction &function) {
	auto catalog = deserializer.ReadProperty<string>(100, "catalog");
	auto schema = deserializer.ReadProperty<string>(101, "schema");
	auto table = deserializer.ReadProperty<string>(102, "table");
	auto &catalog_entry =
	    Catalog::GetEntry<TableCatalogEntry>(deserializer.Get<ClientContext &>(), catalog, schema, table);
	if (catalog_entry.type != CatalogType::TABLE_ENTRY) {
		throw SerializationException("Cant find table for %s.%s", schema, table);
	}
	auto result = make_uniq<TableScanBindData>(catalog_entry.Cast<DuckTableEntry>());
	deserializer.ReadProperty(103, "is_index_scan", result->is_index_scan);
	deserializer.ReadProperty(104, "is_create_index", result->is_create_index);
	deserializer.ReadDeletedProperty<unsafe_vector<row_t>>(105, "result_ids");
	return std::move(result);
}